

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmFGeneric2<(moira::Instr)243,(moira::Mode)3,0>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 *this_00;
  StrWriter *pSVar1;
  Fp local_6c [2];
  Fp local_64 [2];
  Fp local_5c;
  int local_58;
  Ffmt local_54 [2];
  Ea<(moira::Mode)3,_4> local_4c;
  int local_38;
  Ffmt local_34 [2];
  byte local_2c;
  byte local_2b;
  byte local_2a;
  byte local_29;
  u32 local_28;
  u8 fpc;
  u8 dst;
  u8 src;
  u8 reg;
  u32 ext;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  _src = op;
  _ext = addr;
  addr_local = (u32 *)str;
  str_local = (StrWriter *)this;
  local_28 = dasmIncRead<2>(this,addr);
  local_29 = (byte)_src & 7;
  local_2a = (byte)(local_28 >> 10) & 7;
  local_2b = (byte)(local_28 >> 7) & 7;
  local_2c = (byte)local_28 & 7;
  if ((local_28 & 0x4000) == 0) {
    pSVar1 = StrWriter::operator<<((StrWriter *)addr_local);
    Ffmt::Ffmt(local_54,2);
    pSVar1 = StrWriter::operator<<(pSVar1,local_54[0]);
    local_58 = addr_local[0xe];
    pSVar1 = StrWriter::operator<<(pSVar1,(Tab)local_58);
    Fp::Fp(&local_5c,(uint)local_2a);
    StrWriter::operator<<(pSVar1,local_5c);
  }
  else {
    pSVar1 = StrWriter::operator<<((StrWriter *)addr_local);
    Ffmt::Ffmt(local_34,(uint)local_2a);
    pSVar1 = StrWriter::operator<<(pSVar1,local_34[0]);
    local_38 = addr_local[0xe];
    StrWriter::operator<<(pSVar1,(Tab)local_38);
    this_00 = addr_local;
    Op<(moira::Mode)3,4>(&local_4c,this,(ushort)local_29,_ext);
    StrWriter::operator<<((StrWriter *)this_00,&local_4c);
  }
  pSVar1 = StrWriter::operator<<((StrWriter *)addr_local);
  Fp::Fp(local_64,(uint)local_2c);
  pSVar1 = StrWriter::operator<<(pSVar1,local_64[0]);
  pSVar1 = StrWriter::operator<<(pSVar1);
  Fp::Fp(local_6c,(uint)local_2b);
  StrWriter::operator<<(pSVar1,local_6c[0]);
  return;
}

Assistant:

void
Moira::dasmFGeneric2(StrWriter &str, u32 &addr, u16 op) const
{
    auto ext = dasmIncRead(addr);
    auto reg = _____________xxx (op);
    auto src = ___xxx__________ (ext);
    auto dst = ______xxx_______ (ext);
    auto fpc = _____________xxx (ext);

    if (ext & 0x4000) {

        str << Ins<I>{} << Ffmt{src} << str.tab;

        if (M == Mode::IM) {

            u64 val;

            switch (src) {

                case 0: // Long-Word Integer

                    val = dasmIncRead<Long>(addr);
                    str << Ims<Long>(u32(val));
                    break;

                case 1: // Single precision

                    val = dasmIncRead<Long>(addr);
                    str << "#<fixme>";
                    break;

                case 2: // Double precision
                case 3: // Packed-Decimal Real

                    val = dasmIncRead<Long>(addr);
                    dasmIncRead<Long>(addr);
                    dasmIncRead<Long>(addr); // Why???
                    str << "#<fixme>";
                    break;

                case 5: // Double-precision real

                    val = dasmIncRead<Long>(addr);
                    dasmIncRead<Long>(addr);
                    str << "#<fixme>";
                    break;

                case 6: // Byte Integer

                    val = dasmIncRead<Word>(addr);
                    str << Ims<Byte>(u32(val));
                    break;

                default:
                    str << Op<M, Word>(reg, addr);
            }
        } else {
            str << Op<M, Long>(reg, addr);
        }

    } else {
        str << Ins<I>{} << Ffmt{2} << str.tab << Fp{src};
    }

    str << Sep{} << Fp{fpc} << Sep{} << Fp{dst};
}